

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall
sf::priv::WindowImplX11::WindowImplX11
          (WindowImplX11 *this,VideoMode mode,String *title,unsigned_long style,
          ContextSettings *settings)

{
  bool bVar1;
  Display *pDVar2;
  long lVar3;
  ostream *poVar4;
  WindowImplX11 *this_00;
  Atom AVar5;
  undefined8 *puVar6;
  reference pvVar7;
  locale *in_RCX;
  undefined8 in_RSI;
  long *in_RDI;
  ulong in_R8;
  long in_R9;
  long flags;
  XSizeHints *sizeHints_1;
  vector<char,_std::allocator<char>_> windowClass;
  string ansiTitle;
  vector<char,_std::allocator<char>_> windowInstance;
  string executableName;
  XClassHint *hint;
  XSizeHints *sizeHints;
  WMHints hints;
  Atom WMHintsAtom;
  XWMHints *xHints;
  XSetWindowAttributes attributes;
  XVisualInfo visualInfo;
  int depth;
  Visual *visual;
  uint height;
  uint width;
  Vector2i windowPosition;
  undefined8 in_stack_fffffffffffffc98;
  uint uVar8;
  _Vector_impl *this_01;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffcac;
  vector<char,_std::allocator<char>_> *this_02;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  undefined1 onlyIfExists;
  string *in_stack_fffffffffffffcd8;
  locale *locale;
  locale *this_03;
  WindowImpl *in_stack_fffffffffffffd10;
  ContextSettings *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  uint bitsPerPixel;
  Display *in_stack_fffffffffffffd30;
  VideoMode *in_stack_fffffffffffffd38;
  WindowImplX11 *in_stack_fffffffffffffd50;
  byte local_299;
  undefined8 local_278;
  ulong *local_270;
  char *local_268;
  char *local_260;
  undefined8 local_258;
  undefined8 local_250;
  allocator<char> local_242;
  undefined1 local_241;
  vector<char,_std::allocator<char>_> local_240;
  locale local_228 [8];
  string local_220 [32];
  char *local_200;
  char *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  allocator<char> local_1da;
  undefined1 local_1d9;
  WindowImplX11 *in_stack_fffffffffffffe30;
  WindowImplX11 *in_stack_fffffffffffffe40;
  _Vector_impl local_190;
  undefined1 local_161 [33];
  Atom local_140;
  WindowImplX11 *local_138;
  vector<char,_std::allocator<char>_> local_130 [3];
  undefined8 local_e8;
  uint local_d8;
  undefined8 local_d0;
  vector<char,_std::allocator<char>_> *local_c0;
  undefined4 local_ac;
  undefined4 local_7c;
  vector<char,_std::allocator<char>_> *local_78;
  undefined4 local_6c;
  undefined4 local_68;
  Vector2i local_64;
  Vector2i local_5c [2];
  long local_48;
  ulong local_40;
  locale *local_38;
  undefined8 local_18;
  
  bitsPerPixel = (uint)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  onlyIfExists = (undefined1)((ulong)in_stack_fffffffffffffcd0 >> 0x38);
  uVar8 = (uint)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  local_48 = in_R9;
  local_40 = in_R8;
  local_38 = in_RCX;
  local_18 = in_RSI;
  WindowImpl::WindowImpl(in_stack_fffffffffffffd10);
  *in_RDI = (long)&PTR__WindowImplX11_002bcb38;
  in_RDI[0x79] = 0;
  *(undefined4 *)(in_RDI + 0x7b) = 0;
  in_RDI[0x7c] = 0;
  in_RDI[0x7d] = 0;
  *(undefined1 *)(in_RDI + 0x7e) = 0;
  in_RDI[0x7f] = 0;
  in_RDI[0x80] = 0;
  in_RDI[0x81] = 0;
  in_RDI[0x82] = 0;
  *(undefined1 *)(in_RDI + 0x83) = 1;
  Vector2<int>::Vector2((Vector2<int> *)((long)in_RDI + 0x41c),-1,-1);
  *(undefined1 *)((long)in_RDI + 0x424) = 0;
  *(char *)((long)in_RDI + 0x425) = (char)(((uint)local_40 & 8) >> 3);
  *(byte *)((long)in_RDI + 0x426) = *(byte *)((long)in_RDI + 0x425) & 1;
  *(undefined1 *)((long)in_RDI + 0x427) = 0;
  in_RDI[0x85] = 0;
  in_RDI[0x86] = 0;
  in_RDI[0x87] = 0;
  pDVar2 = OpenDisplay();
  in_RDI[0x7a] = (long)pDVar2;
  anon_unknown.dwarf_173c83::WindowsImplX11Impl::ewmhSupported();
  *(undefined4 *)(in_RDI + 0x7b) = *(undefined4 *)(in_RDI[0x7a] + 0xe0);
  Vector2<int>::Vector2(local_5c);
  if ((*(byte *)((long)in_RDI + 0x425) & 1) == 0) {
    local_5c[0].y =
         (*(int *)(*(long *)(in_RDI[0x7a] + 0xe8) + (long)(int)in_RDI[0x7b] * 0x80 + 0x1c) -
         local_18._4_4_) / 2;
    local_5c[0].x =
         (*(int *)(*(long *)(in_RDI[0x7a] + 0xe8) + (long)(int)in_RDI[0x7b] * 0x80 + 0x18) -
         (int)local_18) / 2;
  }
  else {
    local_64 = getPrimaryMonitorPosition((WindowImplX11 *)in_stack_fffffffffffffcc8._M_current);
    local_5c[0] = local_64;
  }
  local_68 = (int)local_18;
  local_6c = local_18._4_4_;
  local_78 = (vector<char,_std::allocator<char>_> *)0x0;
  local_7c = 0;
  if (*(int *)(local_48 + 0x14) == -1) {
    local_78 = *(vector<char,_std::allocator<char>_> **)
                (*(long *)(in_RDI[0x7a] + 0xe8) + (long)(int)in_RDI[0x7b] * 0x80 + 0x40);
    local_7c = *(undefined4 *)
                (*(long *)(in_RDI[0x7a] + 0xe8) + (long)(int)in_RDI[0x7b] * 0x80 + 0x38);
  }
  else {
    GlxContext::selectBestVisual(in_stack_fffffffffffffd30,bitsPerPixel,in_stack_fffffffffffffd20);
    local_78 = local_c0;
    local_7c = local_ac;
  }
  lVar3 = in_RDI[0x7a];
  local_d0 = XCreateColormap(lVar3,*(undefined8 *)
                                    (*(long *)(lVar3 + 0xe8) + 0x10 +
                                    (long)*(int *)(lVar3 + 0xe0) * 0x80),local_78,0);
  local_e8 = 0x63207f;
  local_299 = 0;
  if ((*(byte *)((long)in_RDI + 0x425) & 1) != 0) {
    bVar1 = anon_unknown.dwarf_173c83::WindowsImplX11Impl::ewmhSupported();
    local_299 = bVar1 ^ 0xff;
  }
  local_d8 = local_299 & 1;
  lVar3 = in_RDI[0x7a];
  __last._M_current = (char *)local_130;
  __result._M_current = (char *)0x2a00;
  uVar9 = 1;
  this_01 = (_Vector_impl *)((ulong)uVar8 << 0x20);
  this_02 = local_78;
  lVar3 = XCreateWindow(lVar3,*(undefined8 *)
                               (*(long *)(lVar3 + 0xe8) + 0x10 + (long)*(int *)(lVar3 + 0xe0) * 0x80
                               ),(ulong)local_5c[0] & 0xffffffff,local_5c[0].y,local_68,local_6c,
                        this_01,local_7c);
  in_RDI[0x79] = lVar3;
  if (in_RDI[0x79] == 0) {
    poVar4 = err();
    poVar4 = std::operator<<(poVar4,"Failed to create window");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    setProtocols(in_stack_fffffffffffffe30);
    this_00 = (WindowImplX11 *)XAllocWMHints();
    (this_00->super_WindowImpl)._vptr_WindowImpl = (_func_int **)0x2;
    *(undefined4 *)
     ((long)&(this_00->super_WindowImpl).m_events.c.
             super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.super__Deque_impl_data
             ._M_map + 4) = 1;
    local_138 = this_00;
    XSetWMHints(in_RDI[0x7a],in_RDI[0x79],this_00);
    XFree(local_138);
    if ((*(byte *)((long)in_RDI + 0x425) & 1) == 0) {
      in_stack_fffffffffffffd38 = (VideoMode *)local_161;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_161 + 1),"_MOTIF_WM_HINTS",(allocator *)in_stack_fffffffffffffd38)
      ;
      AVar5 = getAtom(in_stack_fffffffffffffcd8,(bool)onlyIfExists);
      std::__cxx11::string::~string((string *)(local_161 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_161);
      local_140 = AVar5;
      if (AVar5 != 0) {
        memset(&local_190,0,0x28);
        local_190.super__Tp_alloc_type = (_Tp_alloc_type)0x3;
        local_190._1_7_ = 0;
        local_190._16_8_ = 0;
        local_190._8_8_ = 0;
        if ((local_40 & 1) != 0) {
          local_190._16_8_ = 0x3a;
          local_190._8_8_ = 0xc;
        }
        if ((local_40 & 2) != 0) {
          local_190._16_8_ = local_190._16_8_ | 0x44;
          local_190._8_8_ = local_190._8_8_ | 0x12;
        }
        if ((local_40 & 4) != 0) {
          local_190._8_8_ = local_190._8_8_ | 0x20;
        }
        this_01 = &local_190;
        XChangeProperty(in_RDI[0x7a],in_RDI[0x79],local_140,local_140,0x20,0,this_01,5);
      }
    }
    if ((local_40 & 2) == 0) {
      *(undefined1 *)((long)in_RDI + 0x424) = 1;
      puVar6 = (undefined8 *)XAllocSizeHints();
      *puVar6 = 0x31;
      *(undefined4 *)(puVar6 + 4) = local_68;
      *(undefined4 *)(puVar6 + 3) = local_68;
      *(undefined4 *)((long)puVar6 + 0x24) = local_6c;
      *(undefined4 *)((long)puVar6 + 0x1c) = local_6c;
      *(int *)(puVar6 + 1) = local_5c[0].x;
      *(int *)((long)puVar6 + 0xc) = local_5c[0].y;
      XSetWMNormalHints(in_RDI[0x7a],in_RDI[0x79],puVar6);
      XFree(puVar6);
    }
    puVar6 = (undefined8 *)XAllocClassHint();
    (anonymous_namespace)::WindowsImplX11Impl::findExecutableName_abi_cxx11_();
    std::__cxx11::string::size();
    local_1d9 = 0;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)__last._M_current,
               (size_type)__result._M_current,(value_type_conflict *)this_02,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffcac,uVar9));
    std::allocator<char>::~allocator(&local_1da);
    local_1e8 = std::__cxx11::string::begin();
    local_1f0 = std::__cxx11::string::end();
    local_1f8 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                  ((vector<char,_std::allocator<char>_> *)this_01);
    local_200 = (char *)std::
                        copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                                  (in_stack_fffffffffffffcc8,__last,__result);
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&stack0xfffffffffffffe28,0);
    *puVar6 = pvVar7;
    this_03 = local_228;
    locale = local_38;
    std::locale::locale(this_03);
    String::toAnsiString_abi_cxx11_((String *)this_03,locale);
    std::locale::~locale(local_228);
    std::__cxx11::string::size();
    local_241 = 0;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)__last._M_current,
               (size_type)__result._M_current,(value_type_conflict *)this_02,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffcac,uVar9));
    std::allocator<char>::~allocator(&local_242);
    local_250 = std::__cxx11::string::begin();
    local_258 = std::__cxx11::string::end();
    local_260 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                  ((vector<char,_std::allocator<char>_> *)this_01);
    local_268 = (char *)std::
                        copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                                  (in_stack_fffffffffffffcc8,__last,__result);
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](&local_240,0);
    puVar6[1] = pvVar7;
    XSetClassHint(in_RDI[0x7a],in_RDI[0x79],puVar6);
    XFree(puVar6);
    (**(code **)(*in_RDI + 0x38))(in_RDI,local_38);
    initialize(in_stack_fffffffffffffd50);
    if ((*(byte *)((long)in_RDI + 0x425) & 1) != 0) {
      local_270 = (ulong *)XAllocSizeHints();
      local_278 = 0;
      XGetWMNormalHints(in_RDI[0x7a],in_RDI[0x79],local_270,&local_278);
      *local_270 = *local_270 & 0xffffffffffffffcf;
      XSetWMNormalHints(in_RDI[0x7a],in_RDI[0x79],local_270);
      XFree(local_270);
      setVideoMode(this_00,in_stack_fffffffffffffd38);
      switchToFullscreen(in_stack_fffffffffffffe40);
    }
    std::vector<char,_std::allocator<char>_>::~vector(this_02);
    std::__cxx11::string::~string(local_220);
    std::vector<char,_std::allocator<char>_>::~vector(this_02);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
  }
  return;
}

Assistant:

WindowImplX11::WindowImplX11(VideoMode mode, const String& title, unsigned long style, const ContextSettings& settings) :
m_window         (0),
m_screen         (0),
m_inputMethod    (NULL),
m_inputContext   (NULL),
m_isExternal     (false),
m_oldVideoMode   (0),
m_oldRRCrtc      (0),
m_hiddenCursor   (0),
m_lastCursor     (None),
m_keyRepeat      (true),
m_previousSize   (-1, -1),
m_useSizeHints   (false),
m_fullscreen     ((style & Style::Fullscreen) != 0),
m_cursorGrabbed  (m_fullscreen),
m_windowMapped   (false),
m_iconPixmap     (0),
m_iconMaskPixmap (0),
m_lastInputTime  (0)
{
    using namespace WindowsImplX11Impl;

    // Open a connection with the X server
    m_display = OpenDisplay();

    // Make sure to check for EWMH support before we do anything
    ewmhSupported();

    m_screen = DefaultScreen(m_display);

    // Compute position and size
    Vector2i windowPosition;
    if(m_fullscreen)
    {
        windowPosition = getPrimaryMonitorPosition();
    }
    else
    {
        windowPosition.x = (DisplayWidth(m_display, m_screen) - static_cast<int>(mode.width))  / 2;
        windowPosition.y = (DisplayHeight(m_display, m_screen) - static_cast<int>(mode.height)) / 2;
    }

    unsigned int width  = mode.width;
    unsigned int height = mode.height;

    Visual* visual = NULL;
    int depth = 0;

    // Check if the user chose to not create an OpenGL context (settings.attributeFlags will be 0xFFFFFFFF)
    if (settings.attributeFlags == 0xFFFFFFFF)
    {
        // Choose default visual since the user is going to use their own rendering API
        visual = DefaultVisual(m_display, m_screen);
        depth = DefaultDepth(m_display, m_screen);
    }
    else
    {
        // Choose the visual according to the context settings
        XVisualInfo visualInfo = ContextType::selectBestVisual(m_display, mode.bitsPerPixel, settings);

        visual = visualInfo.visual;
        depth = visualInfo.depth;
    }

    // Define the window attributes
    XSetWindowAttributes attributes;
    attributes.colormap = XCreateColormap(m_display, DefaultRootWindow(m_display), visual, AllocNone);
    attributes.event_mask = eventMask;
    attributes.override_redirect = (m_fullscreen && !ewmhSupported()) ? True : False;

    m_window = XCreateWindow(m_display,
                             DefaultRootWindow(m_display),
                             windowPosition.x, windowPosition.y,
                             width, height,
                             0,
                             depth,
                             InputOutput,
                             visual,
                             CWEventMask | CWOverrideRedirect | CWColormap,
                             &attributes);

    if (!m_window)
    {
        err() << "Failed to create window" << std::endl;
        return;
    }

    // Set the WM protocols
    setProtocols();

    // Set the WM initial state to the normal state
    XWMHints* xHints = XAllocWMHints();
    xHints->flags         = StateHint;
    xHints->initial_state = NormalState;
    XSetWMHints(m_display, m_window, xHints);
    XFree(xHints);

    // If not in fullscreen, set the window's style (tell the window manager to
    // change our window's decorations and functions according to the requested style)
    if (!m_fullscreen)
    {
        Atom WMHintsAtom = getAtom("_MOTIF_WM_HINTS", false);
        if (WMHintsAtom)
        {
            static const unsigned long MWM_HINTS_FUNCTIONS   = 1 << 0;
            static const unsigned long MWM_HINTS_DECORATIONS = 1 << 1;

            //static const unsigned long MWM_DECOR_ALL         = 1 << 0;
            static const unsigned long MWM_DECOR_BORDER      = 1 << 1;
            static const unsigned long MWM_DECOR_RESIZEH     = 1 << 2;
            static const unsigned long MWM_DECOR_TITLE       = 1 << 3;
            static const unsigned long MWM_DECOR_MENU        = 1 << 4;
            static const unsigned long MWM_DECOR_MINIMIZE    = 1 << 5;
            static const unsigned long MWM_DECOR_MAXIMIZE    = 1 << 6;

            //static const unsigned long MWM_FUNC_ALL          = 1 << 0;
            static const unsigned long MWM_FUNC_RESIZE       = 1 << 1;
            static const unsigned long MWM_FUNC_MOVE         = 1 << 2;
            static const unsigned long MWM_FUNC_MINIMIZE     = 1 << 3;
            static const unsigned long MWM_FUNC_MAXIMIZE     = 1 << 4;
            static const unsigned long MWM_FUNC_CLOSE        = 1 << 5;

            struct WMHints
            {
                unsigned long flags;
                unsigned long functions;
                unsigned long decorations;
                long          inputMode;
                unsigned long state;
            };

            WMHints hints;
            std::memset(&hints, 0, sizeof(hints));
            hints.flags       = MWM_HINTS_FUNCTIONS | MWM_HINTS_DECORATIONS;
            hints.decorations = 0;
            hints.functions   = 0;

            if (style & Style::Titlebar)
            {
                hints.decorations |= MWM_DECOR_BORDER | MWM_DECOR_TITLE | MWM_DECOR_MINIMIZE | MWM_DECOR_MENU;
                hints.functions   |= MWM_FUNC_MOVE | MWM_FUNC_MINIMIZE;
            }
            if (style & Style::Resize)
            {
                hints.decorations |= MWM_DECOR_MAXIMIZE | MWM_DECOR_RESIZEH;
                hints.functions   |= MWM_FUNC_MAXIMIZE | MWM_FUNC_RESIZE;
            }
            if (style & Style::Close)
            {
                hints.decorations |= 0;
                hints.functions   |= MWM_FUNC_CLOSE;
            }

            XChangeProperty(m_display,
                            m_window,
                            WMHintsAtom,
                            WMHintsAtom,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&hints),
                            5);
        }
    }

    // This is a hack to force some windows managers to disable resizing
    if (!(style & Style::Resize))
    {
        m_useSizeHints = true;
        XSizeHints* sizeHints = XAllocSizeHints();
        sizeHints->flags = PMinSize | PMaxSize | USPosition;
        sizeHints->min_width  = sizeHints->max_width  = static_cast<int>(width);
        sizeHints->min_height = sizeHints->max_height = static_cast<int>(height);
        sizeHints->x = windowPosition.x;
        sizeHints->y = windowPosition.y;
        XSetWMNormalHints(m_display, m_window, sizeHints);
        XFree(sizeHints);
    }

    // Set the window's WM class (this can be used by window managers)
    XClassHint* hint = XAllocClassHint();

    // The instance name should be something unique to this invocation
    // of the application but is rarely if ever used these days.
    // For simplicity, we retrieve it via the base executable name.
    std::string executableName = findExecutableName();
    std::vector<char> windowInstance(executableName.size() + 1, 0);
    std::copy(executableName.begin(), executableName.end(), windowInstance.begin());
    hint->res_name = &windowInstance[0];

    // The class name identifies a class of windows that
    // "are of the same type". We simply use the initial window name as
    // the class name.
    std::string ansiTitle = title.toAnsiString();
    std::vector<char> windowClass(ansiTitle.size() + 1, 0);
    std::copy(ansiTitle.begin(), ansiTitle.end(), windowClass.begin());
    hint->res_class = &windowClass[0];

    XSetClassHint(m_display, m_window, hint);

    XFree(hint);

    // Set the window's name
    setTitle(title);

    // Do some common initializations
    initialize();

    // Set fullscreen video mode and switch to fullscreen if necessary
    if (m_fullscreen)
    {
        // Disable hint for min and max size,
        // otherwise some windows managers will not remove window decorations
        XSizeHints *sizeHints = XAllocSizeHints();
        long flags = 0;
        XGetWMNormalHints(m_display, m_window, sizeHints, &flags);
        sizeHints->flags &= ~(PMinSize | PMaxSize);
        XSetWMNormalHints(m_display, m_window, sizeHints);
        XFree(sizeHints);

        setVideoMode(mode);
        switchToFullscreen();
    }
}